

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O0

void __thiscall
ImageProvider::provideStreamData(ImageProvider *this,QPDFObjGen *param_1,Pipeline *pipeline)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  ulong local_b8;
  size_t j;
  size_t i;
  shared_ptr<Pl_RunLength> local_a0;
  unsigned_long local_90;
  J_COLOR_SPACE local_84;
  size_t local_80;
  uint local_78;
  uint local_74;
  shared_ptr<Pl_DCT> local_70 [2];
  undefined1 local_50 [8];
  shared_ptr<Pipeline> p_new;
  Pipeline *p;
  vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> to_delete;
  Pipeline *pipeline_local;
  QPDFObjGen *param_1_local;
  ImageProvider *this_local;
  
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)pipeline;
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::vector
            ((vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> *)&p);
  p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       to_delete.
       super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::shared_ptr<Pipeline>::shared_ptr((shared_ptr<Pipeline> *)local_50);
  bVar2 = std::operator==(&this->filter,"/DCTDecode");
  if (bVar2) {
    local_74 = QIntC::to_uint<unsigned_long>(&this->width);
    local_80 = getHeight(this);
    local_78 = QIntC::to_uint<unsigned_long>(&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->stripes,0);
    local_90 = std::__cxx11::string::length();
    local_84 = QIntC::to_int<unsigned_long>(&local_90);
    std::
    make_shared<Pl_DCT,char_const(&)[14],Pipeline*&,unsigned_int,unsigned_int,int,J_COLOR_SPACE&>
              ((char (*) [14])local_70,(Pipeline **)"image encoder",
               (uint *)&to_delete.
                        super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_74,
               (int *)&local_78,&local_84);
    std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_50,local_70);
    std::shared_ptr<Pl_DCT>::~shared_ptr(local_70);
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
              ((vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> *)&p,
               (shared_ptr<Pipeline> *)local_50);
    p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_50);
  }
  else {
    bVar2 = std::operator==(&this->filter,"/RunLengthDecode");
    if (bVar2) {
      std::make_shared<Pl_RunLength,char_const(&)[14],Pipeline*&,Pl_RunLength::action_e>
                ((char (*) [14])&local_a0,(Pipeline **)"image encoder",
                 (action_e *)
                 &to_delete.
                  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<Pipeline>::operator=((shared_ptr<Pipeline> *)local_50,&local_a0);
      std::shared_ptr<Pl_RunLength>::~shared_ptr(&local_a0);
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                ((vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> *)
                 &p,(shared_ptr<Pipeline> *)local_50);
      p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)local_50);
    }
  }
  for (j = 0; j < this->n_stripes; j = j + 1) {
    for (local_b8 = 0;
        _Var1._M_pi = p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi, local_b8 < this->width * this->stripe_height; local_b8 = local_b8 + 1)
    {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->stripes,j);
      Pipeline::writeString((string *)_Var1._M_pi);
    }
  }
  (*(p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base[3])();
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_50);
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::~vector
            ((vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> *)&p);
  return;
}

Assistant:

void
ImageProvider::provideStreamData(QPDFObjGen const&, Pipeline* pipeline)
{
    std::vector<std::shared_ptr<Pipeline>> to_delete;
    Pipeline* p = pipeline;
    std::shared_ptr<Pipeline> p_new;

    if (filter == "/DCTDecode") {
        p_new = std::make_shared<Pl_DCT>(
            "image encoder",
            pipeline,
            QIntC::to_uint(width),
            QIntC::to_uint(getHeight()),
            QIntC::to_int(stripes[0].length()),
            j_color_space);
        to_delete.push_back(p_new);
        p = p_new.get();
    } else if (filter == "/RunLengthDecode") {
        p_new = std::make_shared<Pl_RunLength>("image encoder", pipeline, Pl_RunLength::a_encode);
        to_delete.push_back(p_new);
        p = p_new.get();
    }

    for (size_t i = 0; i < n_stripes; ++i) {
        for (size_t j = 0; j < width * stripe_height; ++j) {
            p->writeString(stripes[i]);
        }
    }
    p->finish();
}